

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O3

void __thiscall nestl::impl::shared_count_base::release(shared_count_base *this)

{
  long lVar1;
  
  if (this->m_use_count < 1) {
    __assert_fail("m_use_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/shared_ptr.hpp"
                  ,0x31,"void nestl::impl::shared_count_base::release()");
  }
  lVar1 = this->m_use_count + -1;
  this->m_use_count = lVar1;
  if (lVar1 == 0) {
    (*this->_vptr_shared_count_base[2])(this);
    if (this->m_weak_use_count == 0) {
      (*this->_vptr_shared_count_base[3])(this);
      return;
    }
  }
  return;
}

Assistant:

void release() NESTL_NOEXCEPT_SPEC
    {
		assert(m_use_count > 0);
        --m_use_count;
        if (m_use_count == 0)
        {
            destroy_value();
            if (m_weak_use_count == 0)
            {
                destroy_self();
            }
        }
    }